

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

bool __thiscall
GlobOpt::CSEOptimize
          (GlobOpt *this,BasicBlock *block,Instr **instrRef,Value **pSrc1Val,Value **pSrc2Val,
          Value **pSrc1IndirIndexVal,bool intMathExprOnly)

{
  GlobOptBlockData *this_00;
  IRType IVar1;
  OpCode OVar2;
  Value *pVVar3;
  ValueInfo *pVVar4;
  Opnd *pOVar5;
  StackSym *this_01;
  code *pcVar6;
  uint uVar7;
  BasicBlock *pBVar8;
  bool bVar9;
  BOOLEAN BVar10;
  bool bVar11;
  ExprAttributes exprAttributes;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  IndirOpnd *pIVar15;
  Value **ppVVar16;
  SymOpnd *pSVar17;
  PropertySymOpnd *this_02;
  RegOpnd *pRVar18;
  StackSym *pSVar19;
  Instr *pIVar20;
  Value *pVVar21;
  JITTimeFunctionBody *pJVar22;
  char16 *pcVar23;
  char16 *pcVar24;
  AddrOpnd *this_03;
  Instr *this_04;
  byte bVar25;
  int32 local_70;
  uint local_6c;
  int32 intConstantValue_1;
  int32 intConstantValue;
  GlobOptBlockData *local_60;
  Value *local_58;
  Value *local_50;
  ValueInfo *local_48;
  BasicBlock *local_40;
  ExprHash local_34 [2];
  ExprHash hash;
  
  local_40 = block;
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d5,"(instrRef)","instrRef");
    if (!bVar9) goto LAB_004694d7;
    *puVar14 = 0;
  }
  if (*instrRef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d7,"(instr)","instr");
    if (!bVar9) goto LAB_004694d7;
    *puVar14 = 0;
  }
  bVar9 = DoCSE(this);
  if (!bVar9) {
    return false;
  }
  local_50 = *pSrc1Val;
  pVVar21 = *pSrc2Val;
  pVVar3 = *pSrc1IndirIndexVal;
  local_34[0] = (ExprHash)0x0;
  pIVar20 = *instrRef;
  OVar2 = pIVar20->m_opcode;
  if (((ulong)OVar2 < 0x3b) && ((0x40b610000000000U >> ((ulong)OVar2 & 0x3f) & 1) != 0)) {
    if (intMathExprOnly && (*(uint *)&this->field_0xf4 & 0xc) == 0) {
      return false;
    }
    exprAttributes.attributes = *(uint *)&this->field_0xf4 >> 2 & 3;
LAB_00468ce9:
    bVar25 = 0;
  }
  else {
    if (OVar2 - 0x1df < 2) {
      bVar9 = IR::Opnd::IsUnsigned(pIVar20->m_dst);
      bVar11 = IR::Opnd::IsUnsigned((*instrRef)->m_src1);
      exprAttributes.attributes = bVar9 + 2;
      if (!bVar11) {
        exprAttributes.attributes = (uint)bVar9;
      }
      pIVar20 = *instrRef;
      goto LAB_00468ce9;
    }
    if ((OVar2 == LdArrViewElem) || (OVar2 == LdElemI_A)) {
      if (intMathExprOnly) {
        return false;
      }
      pIVar15 = IR::Opnd::AsIndirOpnd(pIVar20->m_src1);
      this_00 = &local_40->globOptData;
      local_50 = GlobOptBlockData::FindValue(this_00,&pIVar15->m_baseOpnd->m_sym->super_Sym);
      pVVar21 = pVVar3;
      if (pVVar3 == (Value *)0x0) {
        if (pIVar15->m_indexOpnd == (RegOpnd *)0x0) {
          return false;
        }
        pVVar21 = GlobOptBlockData::FindValue(this_00,&pIVar15->m_indexOpnd->m_sym->super_Sym);
      }
      bVar9 = ValueType::IsLikelyOptimizedVirtualTypedArray(&local_50->valueInfo->super_ValueType);
      pIVar20 = *instrRef;
      bVar25 = 1;
      exprAttributes.attributes = 0;
      if (bVar9) {
        uVar7 = (uint)((*(ushort *)&pIVar20->field_0x36 >> 0xe & 1) == 0);
        exprAttributes.attributes = uVar7 + 2;
        if ((short)*(ushort *)&pIVar20->field_0x36 < 0) {
          exprAttributes.attributes = uVar7;
        }
      }
    }
    else {
      bVar25 = 0;
      exprAttributes.attributes = 0;
      if (intMathExprOnly) {
        return false;
      }
    }
  }
  bVar9 = GetHash(this,pIVar20,local_50,pVVar21,exprAttributes,local_34);
  pBVar8 = local_40;
  if (!bVar9) {
    return false;
  }
  ppVVar16 = ValueHashTable<ExprHash,_Value_*>::Get
                       ((local_40->globOptData).exprToValueMap,(uint)local_34[0]);
  if (ppVVar16 == (Value **)0x0) {
    return false;
  }
  local_60 = &pBVar8->globOptData;
  pIVar20 = *instrRef;
  if (pIVar20->m_dst == (Opnd *)0x0) {
    local_58 = (Value *)0x0;
    pSVar19 = (StackSym *)0x0;
    local_48 = (ValueInfo *)0x0;
  }
  else {
    pVVar3 = *ppVVar16;
    if (pVVar3 == (Value *)0x0) {
      return false;
    }
    if ((bVar25 != 0) &&
       (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((pBVar8->globOptData).liveArrayValues,(BVIndex)local_34[0]),
       BVar10 == '\0')) {
      return false;
    }
    pVVar4 = pVVar3->valueInfo;
    pSVar19 = (StackSym *)pVVar4->symStore;
    local_48 = (ValueInfo *)pVVar3;
    if (pSVar19 == (StackSym *)0x0) {
      bVar9 = ValueInfo::TryGetIntConstantValue(pVVar4,&local_70,false);
      if ((bVar25 & bVar9) != 1) {
        return false;
      }
      bVar9 = ValueType::IsIntAndLikelyTagged(&pVVar4->super_ValueType);
      if (!bVar9) {
        return false;
      }
      pSVar19 = GetTaggedIntConstantStackSym(this,local_70);
      if (pSVar19 == (StackSym *)0x0) {
        return false;
      }
    }
    if ((pSVar19->super_Sym).m_kind != SymKindStack) {
      return false;
    }
    local_58 = GlobOptBlockData::FindValue(local_60,&pSVar19->super_Sym);
    if (local_58 == (Value *)0x0) {
      return false;
    }
    if (local_58->valueNumber != *(ValueNumber *)&local_48->_vptr_ValueInfo) {
      return false;
    }
    local_48 = local_58->valueInfo;
    pIVar20 = *instrRef;
  }
  pOVar5 = pIVar20->m_src1;
  if (pOVar5 != (Opnd *)0x0) {
    if (local_50 == (Value *)0x0) {
      return false;
    }
    if (((uint)local_34[0] >> 8 & 0x7ff) != local_50->valueNumber) {
      return false;
    }
    bVar9 = IR::Opnd::IsSymOpnd(pOVar5);
    if (bVar9) {
      pSVar17 = IR::Opnd::AsSymOpnd(pOVar5);
      bVar9 = IR::SymOpnd::IsPropertySymOpnd(pSVar17);
      if (bVar9) {
        if ((*instrRef)->m_opcode != CheckFixedFld) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x280,"(instr->m_opcode == Js::OpCode::CheckFixedFld)",
                             "instr->m_opcode == Js::OpCode::CheckFixedFld");
          if (!bVar9) goto LAB_004694d7;
          *puVar14 = 0;
        }
        pSVar17 = IR::Opnd::AsSymOpnd(pOVar5);
        this_02 = IR::Opnd::AsPropertySymOpnd(&pSVar17->super_Opnd);
        if ((((this_02->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) &&
           (bVar9 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_02), !bVar9)) {
          return false;
        }
      }
    }
    pIVar20 = *instrRef;
    if (pIVar20->m_src2 != (Opnd *)0x0) {
      if (pVVar21 == (Value *)0x0) {
        return false;
      }
      if (((uint)local_34[0] >> 0x13 & 0x7ff) != pVVar21->valueNumber) {
        return false;
      }
    }
  }
  _intConstantValue_1 = pSVar19;
  bVar9 = MayNeedBailOnImplicitCall(pIVar20,local_50,pVVar21);
  if (!bVar9) goto LAB_00468fe5;
  OVar2 = (*instrRef)->m_opcode;
  if (((OVar2 == StElemI_A) ||
      (pOVar5 = (*instrRef)->m_src1, pOVar5 == (Opnd *)0x0 || OVar2 == StElemI_A_Strict)) ||
     (bVar9 = IR::Opnd::IsRegOpnd(pOVar5), !bVar9)) {
LAB_0046902c:
    pOVar5 = (*instrRef)->m_src1;
    bVar9 = true;
    if ((pOVar5 != (Opnd *)0x0) && (bVar11 = IR::Opnd::IsRegOpnd(pOVar5), bVar11)) {
      pRVar18 = IR::Opnd::AsRegOpnd(pOVar5);
      pSVar19 = pRVar18->m_sym;
      if ((pSVar19->field_0x1a & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                            ,0x2c4,"(!varSym1->IsTypeSpec())","!varSym1->IsTypeSpec()");
        if (!bVar11) goto LAB_004694d7;
        *puVar14 = 0;
      }
      BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((local_40->globOptData).liveFields,(pSVar19->super_Sym).m_id);
      if (BVar10 == '\0') {
        return false;
      }
      pOVar5 = (*instrRef)->m_src2;
      if ((pOVar5 != (Opnd *)0x0) && (bVar11 = IR::Opnd::IsRegOpnd(pOVar5), bVar11)) {
        pRVar18 = IR::Opnd::AsRegOpnd(pOVar5);
        pSVar19 = pRVar18->m_sym;
        if ((pSVar19->field_0x1a & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                              ,0x2ce,"(!varSym2->IsTypeSpec())","!varSym2->IsTypeSpec()");
          if (!bVar11) goto LAB_004694d7;
          *puVar14 = 0;
        }
        BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((local_40->globOptData).liveFields,(pSVar19->super_Sym).m_id);
        if (BVar10 == '\0') {
          return false;
        }
      }
    }
  }
  else {
    pRVar18 = IR::Opnd::AsRegOpnd(pOVar5);
    pSVar19 = pRVar18->m_sym;
    bVar9 = GlobOptBlockData::IsTypeSpecialized(local_60,&pSVar19->super_Sym);
    if ((!bVar9) &&
       (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((local_40->globOptData).liveInt32Syms,(pSVar19->super_Sym).m_id),
       BVar10 == '\0')) goto LAB_0046902c;
    pOVar5 = (*instrRef)->m_src2;
    if ((pOVar5 != (Opnd *)0x0) && (bVar9 = IR::Opnd::IsImmediateOpnd(pOVar5), !bVar9)) {
      bVar9 = IR::Opnd::IsRegOpnd(pOVar5);
      if (bVar9) {
        pRVar18 = IR::Opnd::AsRegOpnd(pOVar5);
        pSVar19 = pRVar18->m_sym;
        bVar9 = GlobOptBlockData::IsTypeSpecialized(local_60,&pSVar19->super_Sym);
        if ((bVar9) ||
           (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((local_40->globOptData).liveInt32Syms,(pSVar19->super_Sym).m_id),
           BVar10 != '\0')) goto LAB_00468fe5;
      }
      goto LAB_0046902c;
    }
LAB_00468fe5:
    bVar9 = false;
  }
  pIVar20 = *instrRef;
  if (pIVar20->m_dst != (Opnd *)0x0) {
    IVar1 = pIVar20->m_dst->m_type;
    pSVar19 = Sym::AsStackSym(&_intConstantValue_1->super_Sym);
    if (IVar1 != pSVar19->m_type) {
      if ((this->field_0xf7 & 2) != 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x2dc,"(GetIsAsmJSFunc())","GetIsAsmJSFunc()");
      if (bVar9) {
        *puVar14 = 0;
        return false;
      }
      goto LAB_004694d7;
    }
    pIVar20 = *instrRef;
  }
  pSVar19 = _intConstantValue_1;
  if (pIVar20->m_opcode == ExtendArg_A) {
    pOVar5 = pIVar20->m_dst;
    pVVar21 = GlobOptBlockData::FindValue
                        (&this->currentBlock->globOptData,&_intConstantValue_1->super_Sym);
    GlobOptBlockData::SetValue(&this->currentBlock->globOptData,pVVar21,pOVar5);
    pRVar18 = IR::Opnd::AsRegOpnd(pOVar5);
    this_01 = pRVar18->m_sym;
    pSVar19 = Sym::AsStackSym(&pSVar19->super_Sym);
    StackSym::CopySymAttrs(this_01,pSVar19);
    return false;
  }
  uVar12 = Func::GetSourceContextId(this->func);
  uVar13 = Func::GetLocalFunctionId(this->func);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,CSEPhase,uVar12,uVar13);
  if (bVar11) {
    pJVar22 = Func::GetJITFunctionBody(this->func);
    pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
    Output::Print(L" --- CSE (%s): ",pcVar23);
    IR::Instr::Dump(*instrRef);
  }
  uVar12 = Func::GetSourceContextId(this->func);
  uVar13 = Func::GetLocalFunctionId(this->func);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,CSEPhase,uVar12,uVar13);
  if (bVar11) {
    pJVar22 = Func::GetJITFunctionBody(this->func);
    pcVar23 = JITTimeFunctionBody::GetDisplayName(pJVar22);
    pcVar24 = Js::OpCodeUtil::GetOpCodeName((*instrRef)->m_opcode);
    Output::Print(L" --- CSE (%s): %s\n",pcVar23,pcVar24);
  }
  CaptureByteCodeSymUses(this,*instrRef);
  if ((*instrRef)->m_dst == (Opnd *)0x0) {
    (*instrRef)->m_opcode = Nop;
  }
  else {
    if (local_48 == (ValueInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                          ,0x305,"(valueInfo)","valueInfo");
      if (!bVar11) {
LAB_004694d7:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar14 = 0;
    }
    pVVar4 = local_48;
    pSVar19 = Sym::AsStackSym(&_intConstantValue_1->super_Sym);
    this_03 = (AddrOpnd *)IR::RegOpnd::New(pSVar19,(*instrRef)->m_dst->m_type,(*instrRef)->m_func);
    IR::Opnd::SetValueType
              ((Opnd *)this_03,
               (ValueType)
               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pVVar4->super_ValueType).field_0.field_0);
    IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_03,true);
    if (bVar9) {
      CaptureNoImplicitCallUses(this,(Opnd *)this_03,false,(Instr *)0x0);
    }
    pVVar4 = local_48;
    bVar9 = ValueInfo::TryGetIntConstantValue(local_48,(int32 *)&local_6c,false);
    if (bVar9) {
      bVar9 = ValueType::IsIntAndLikelyTagged(&pVVar4->super_ValueType);
      if (bVar9) {
        IR::Opnd::Free((Opnd *)this_03,this->func);
        this_03 = IR::AddrOpnd::New((Var)((ulong)local_6c | 0x1000000000000),AddrOpndKindConstantVar
                                    ,(*instrRef)->m_func,false,(Var)0x0);
        IR::Opnd::SetValueType
                  (&this_03->super_Opnd,
                   (ValueType)
                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &(pVVar4->super_ValueType).field_0.field_0);
      }
    }
    *pSrc1Val = local_58;
    pIVar20 = *instrRef;
    this_04 = IR::Instr::New(Ld_A,pIVar20->m_dst,&this_03->super_Opnd,pIVar20->m_func);
    *instrRef = this_04;
    IR::Instr::SetByteCodeOffset(this_04,pIVar20);
    IR::Instr::TransferDstAttributesTo(pIVar20,*instrRef);
    pBVar8 = local_40;
    BasicBlock::InsertInstrBefore(local_40,*instrRef,pIVar20);
    BasicBlock::RemoveInstr(pBVar8,pIVar20);
    *pSrc2Val = (Value *)0x0;
    *pSrc1IndirIndexVal = (Value *)0x0;
  }
  return true;
}

Assistant:

bool
GlobOpt::CSEOptimize(BasicBlock *block, IR::Instr * *const instrRef, Value **pSrc1Val, Value **pSrc2Val, Value **pSrc1IndirIndexVal, bool intMathExprOnly)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    if (!this->DoCSE())
    {
        return false;
    }

    Value *src1Val = *pSrc1Val;
    Value *src2Val = *pSrc2Val;
    Value *src1IndirIndexVal = *pSrc1IndirIndexVal;
    bool isArray = false;
    ExprAttributes exprAttributes;
    ExprHash hash;

    // For arrays, hash the value # of the baseOpnd and indexOpnd
    switch(instr->m_opcode)
    {
        case Js::OpCode::LdArrViewElem:
        case Js::OpCode::LdElemI_A:
        {
            if(intMathExprOnly)
            {
                return false;
            }

            IR::IndirOpnd *arrayOpnd = instr->GetSrc1()->AsIndirOpnd();

            src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
            if(src1IndirIndexVal)
            {
                src2Val = src1IndirIndexVal;
            }
            else if (arrayOpnd->GetIndexOpnd())
            {
                src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
            }
            else
            {
                return false;
            }
            // for typed array do not add instructions whose dst are guaranteed to be int or number
            // as we will try to eliminate bound check for these typed arrays
            if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
            {
                exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
            }
            isArray = true;
            break;
        }

        case Js::OpCode::Neg_A:
        case Js::OpCode::Add_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::ShrU_A:
            // If the previously-computed matching expression ignored int overflow or negative zero, those attributes must match
            // to be able to CSE this expression
            if(intMathExprOnly && !ignoredIntOverflowForCurrentInstr && !ignoredNegativeZeroForCurrentInstr)
            {
                // Already tried CSE with default attributes
                return false;
            }
            exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
            break;

        case Js::OpCode::Conv_Prim:
        case Js::OpCode::Conv_Prim_Sat:
            exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
            break;

        default:
            if(intMathExprOnly)
            {
                return false;
            }
            break;
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return false;
    }

    // See if we have a value for that expression
    Value ** pVal = block->globOptData.exprToValueMap->Get(hash);

    if (pVal == NULL)
    {
        return false;
    }

    ValueInfo *valueInfo = NULL;
    Sym *symStore = NULL;
    Value *val = NULL;

    if (instr->GetDst())
    {

        if (*pVal == NULL)
        {
            return false;
        }

        val = *pVal;

        // Make sure the array value is still live.  We can't CSE something like:
        //    ... = A[i];
        //   B[j] = ...;
        //    ... = A[i];
        if (isArray && !block->globOptData.liveArrayValues->Test(hash))
        {
            return false;
        }

        // See if the symStore is still valid
        valueInfo = val->GetValueInfo();
        symStore = valueInfo->GetSymStore();
        Value * symStoreVal = NULL;

        int32 intConstantValue;
        if (!symStore && valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            // Handle:
            //  A[i] = 10;
            //    ... = A[i];
            if (!isArray)
            {
                return false;
            }
            if (!valueInfo->IsIntAndLikelyTagged())
            {
                return false;
            }

            symStore = GetTaggedIntConstantStackSym(intConstantValue);
        }

        if(!symStore || !symStore->IsStackSym())
        {
            return false;
        }
        symStoreVal = block->globOptData.FindValue(symStore);

        if (!symStoreVal || symStoreVal->GetValueNumber() != val->GetValueNumber())
        {
            return false;
        }
        val = symStoreVal;
        valueInfo = val->GetValueInfo();
    }

    // Make sure srcs still have same values

    if (instr->GetSrc1())
    {
        if (!src1Val)
        {
            return false;
        }
        if (hash.GetSrc1ValueNumber() != src1Val->GetValueNumber())
        {
            return false;
        }

        IR::Opnd *src1 = instr->GetSrc1();

        if (src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())
        {
            Assert(instr->m_opcode == Js::OpCode::CheckFixedFld);
            IR::PropertySymOpnd *propOpnd = src1->AsSymOpnd()->AsPropertySymOpnd();

            if (!propOpnd->IsTypeChecked() && !propOpnd->IsRootObjectNonConfigurableFieldLoad())
            {
                // Require m_CachedTypeChecked for 2 reasons:
                // - We may be relying on this instruction to do a type check for a downstream reference.
                // - This instruction may have a different inline cache, and thus need to check a different type,
                //   than the upstream check.
                // REVIEW: We could process this differently somehow to get the type check on the next reference.
                return false;
            }
        }
        if (instr->GetSrc2())
        {
            if (!src2Val)
            {
                return false;
            }
            if (hash.GetSrc2ValueNumber() != src2Val->GetValueNumber())
            {
                return false;
            }
        }
    }
    bool needsBailOnImplicitCall = false;

    // Need implicit call bailouts?
    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        needsBailOnImplicitCall = true;

        IR::Opnd *src1 = instr->GetSrc1();

        if (instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict
            && src1 && src1->IsRegOpnd())
        {
            StackSym *sym1 = src1->AsRegOpnd()->m_sym;

            if (block->globOptData.IsTypeSpecialized(sym1) || block->globOptData.liveInt32Syms->Test(sym1->m_id))
            {
                IR::Opnd *src2 = instr->GetSrc2();

                if (!src2 || src2->IsImmediateOpnd())
                {
                    needsBailOnImplicitCall = false;
                }
                else if (src2->IsRegOpnd())
                {
                    StackSym *sym2 = src2->AsRegOpnd()->m_sym;
                    if (block->globOptData.IsTypeSpecialized(sym2) || block->globOptData.liveInt32Syms->Test(sym2->m_id))
                    {
                        needsBailOnImplicitCall = false;
                    }
                }
            }
        }
    }

    if (needsBailOnImplicitCall)
    {
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym1 = src1->AsRegOpnd()->m_sym;

                Assert(!varSym1->IsTypeSpec());
                if (!block->globOptData.liveFields->Test(varSym1->m_id))
                {
                    return false;
                }
                IR::Opnd *src2 = instr->GetSrc2();
                if (src2 && src2->IsRegOpnd())
                {
                    StackSym *varSym2 = src2->AsRegOpnd()->m_sym;

                    Assert(!varSym2->IsTypeSpec());
                    if (!block->globOptData.liveFields->Test(varSym2->m_id))
                    {
                        return false;
                    }
                }
            }
        }
    }
    // in asmjs we can have a symstore with a different type
    //  x = HEAPF32[i >> 2]
    //  y  = HEAPI32[i >> 2]
    if (instr->GetDst() && (instr->GetDst()->GetType() != symStore->AsStackSym()->GetType()))
    {
        Assert(GetIsAsmJSFunc());
        return false;
    }

    // SIMD_JS
    if (instr->m_opcode == Js::OpCode::ExtendArg_A)
    {
        // we don't want to CSE ExtendArgs, only the operation using them. To do that, we mimic CSE by transferring the symStore valueInfo to the dst.
        IR::Opnd *dst = instr->GetDst();
        Value *dstVal = this->currentBlock->globOptData.FindValue(symStore);
        this->currentBlock->globOptData.SetValue(dstVal, dst);
        dst->AsRegOpnd()->m_sym->CopySymAttrs(symStore->AsStackSym());
        return false;
    }

    //
    // Success, do the CSE rewrite.
    //

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): "), this->func->GetJITFunctionBody()->GetDisplayName());
        instr->Dump();
    }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): %s\n"), this->func->GetJITFunctionBody()->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    this->CaptureByteCodeSymUses(instr);

    if (!instr->GetDst())
    {
        instr->m_opcode = Js::OpCode::Nop;
        return true;
    }

    AnalysisAssert(valueInfo);

    IR::Opnd *cseOpnd;

    cseOpnd = IR::RegOpnd::New(symStore->AsStackSym(), instr->GetDst()->GetType(), instr->m_func);
    cseOpnd->SetValueType(valueInfo->Type());
    cseOpnd->SetIsJITOptimizedReg(true);

    if (needsBailOnImplicitCall)
    {
        this->CaptureNoImplicitCallUses(cseOpnd, false);
    }

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue) && valueInfo->IsIntAndLikelyTagged())
    {
        cseOpnd->Free(func);
        cseOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);
        cseOpnd->SetValueType(valueInfo->Type());
    }

    *pSrc1Val = val;

    {
        // Profiled instructions have data that is interpreted differently based on the op code. Since we're changing the op
        // code and due to other similar potential issues, always create a new instr instead of changing the existing one.
        IR::Instr *const originalInstr = instr;
        instr = IR::Instr::New(Js::OpCode::Ld_A, instr->GetDst(), cseOpnd, instr->m_func);
        instr->SetByteCodeOffset(originalInstr);
        originalInstr->TransferDstAttributesTo(instr);
        block->InsertInstrBefore(instr, originalInstr);
        block->RemoveInstr(originalInstr);
    }

    *pSrc2Val = NULL;
    *pSrc1IndirIndexVal = NULL;
    return true;
}